

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder1<helics::MessageTimer::addTimer(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  int32_t index;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined7 in_register_00000031;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_59;
  shared_ptr<helics::MessageTimer> local_58;
  int32_t local_48;
  _func_void_impl_base_ptr_bool *local_40;
  error_category *peStack_38;
  ptr local_30;
  
  local_30.a = &local_59;
  local_58.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[1].complete_;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[2].complete_;
  base[2].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[1].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  index = *(int32_t *)&base[3].complete_;
  local_40 = base[4].complete_;
  peStack_38 = (error_category *)base[5].complete_;
  local_58.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this;
  local_48 = index;
  local_30.v = base;
  local_30.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  if ((int)CONCAT71(in_register_00000031,call) != 0) {
    helics::processTimerCallback(&local_58,index,(error_code *)&local_40);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }